

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O1

void __thiscall Fl_Preferences::Node::set(Node *this,char *name,char *value)

{
  Entry *pEVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Entry *pEVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar6 = (ulong)this->nEntry_;
  bVar8 = 0 < (long)uVar6;
  if (0 < (long)uVar6) {
    pEVar5 = this->entry_;
    iVar2 = strcmp(name,pEVar5->name);
    if (iVar2 == 0) {
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      do {
        if (uVar6 - 1 == uVar7) goto LAB_001c5038;
        pEVar1 = pEVar5 + 1;
        pEVar5 = pEVar5 + 1;
        iVar2 = strcmp(name,pEVar1->name);
        uVar7 = uVar7 + 1;
      } while (iVar2 != 0);
      bVar8 = uVar7 < uVar6;
    }
    if (value != (char *)0x0) {
      pcVar4 = pEVar5->value;
      iVar2 = strcmp(value,pcVar4);
      if (iVar2 != 0) {
        if (pcVar4 != (char *)0x0) {
          free(pcVar4);
        }
        pcVar4 = strdup(value);
        this->entry_[uVar7].value = pcVar4;
        this->field_0x30 = this->field_0x30 | 1;
      }
      lastEntrySet = (int)uVar7;
    }
    if (bVar8) {
      return;
    }
  }
LAB_001c5038:
  iVar2 = this->NEntry_;
  if (iVar2 == this->nEntry_) {
    iVar3 = 10;
    if (iVar2 != 0) {
      iVar3 = iVar2 * 2;
    }
    this->NEntry_ = iVar3;
    pEVar5 = (Entry *)realloc(this->entry_,(long)iVar3 << 4);
    this->entry_ = pEVar5;
  }
  pcVar4 = strdup(name);
  pEVar5 = this->entry_;
  iVar2 = this->nEntry_;
  pEVar5[iVar2].name = pcVar4;
  if (value == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = strdup(value);
  }
  pEVar5[iVar2].value = pcVar4;
  lastEntrySet = iVar2;
  this->nEntry_ = iVar2 + 1;
  this->field_0x30 = this->field_0x30 | 1;
  return;
}

Assistant:

void Fl_Preferences::Node::set( const char *name, const char *value )
{
  for ( int i=0; i<nEntry_; i++ ) {
    if ( strcmp( name, entry_[i].name ) == 0 ) {
      if ( !value ) return; // annotation
      if ( strcmp( value, entry_[i].value ) != 0 ) {
	if ( entry_[i].value )
	  free( entry_[i].value );
	entry_[i].value = strdup( value );
	dirty_ = 1;
      }
      lastEntrySet = i;
      return;
    }
  }
  if ( NEntry_==nEntry_ ) {
    NEntry_ = NEntry_ ? NEntry_*2 : 10;
    entry_ = (Entry*)realloc( entry_, NEntry_ * sizeof(Entry) );
  }
  entry_[ nEntry_ ].name = strdup( name );
  entry_[ nEntry_ ].value = value?strdup( value ):0;
  lastEntrySet = nEntry_;
  nEntry_++;
  dirty_ = 1;
}